

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_dpb.c
# Opt level: O0

MPP_RET init_dpb(H264dVideoCtx_t *p_Vid,H264_DpbBuf_t *p_Dpb,RK_S32 type)

{
  H264_SPS_t *active_sps_00;
  h264_frame_store_t **pphVar1;
  H264_FrameStore_t *pHVar2;
  H264_StorePic_t *pHVar3;
  RK_U32 local_40;
  RK_U32 dpb_size;
  H264_SPS_t *active_sps;
  uint local_28;
  MPP_RET ret;
  RK_U32 i;
  RK_S32 type_local;
  H264_DpbBuf_t *p_Dpb_local;
  H264dVideoCtx_t *p_Vid_local;
  
  active_sps_00 = p_Vid->active_sps;
  if (active_sps_00 == (H264_SPS_t *)0x0) {
    active_sps._4_4_ = MPP_NOK;
  }
  else {
    p_Dpb->p_Vid = p_Vid;
    if (p_Dpb->init_done != 0) {
      free_dpb(p_Dpb);
    }
    local_40 = getDpbSize(p_Vid,active_sps_00);
    if (local_40 == 0) {
      local_40 = 1;
    }
    p_Dpb->size = local_40;
    p_Dpb->allocated_size = p_Dpb->size;
    p_Dpb->num_ref_frames = active_sps_00->max_num_ref_frames;
    if ((active_sps_00->max_dec_frame_buffering < active_sps_00->max_num_ref_frames) &&
       ((h264d_debug & 4) != 0)) {
      _mpp_log_l(4,"h264d_dpb","DPB size at specified level is smaller than reference frames",
                 (char *)0x0);
    }
    p_Dpb->used_size = 0;
    p_Dpb->last_picture = (h264_frame_store_t *)0x0;
    p_Dpb->ref_frames_in_buffer = 0;
    p_Dpb->ltref_frames_in_buffer = 0;
    pphVar1 = (h264_frame_store_t **)mpp_osal_calloc("init_dpb",(ulong)p_Dpb->size << 3);
    p_Dpb->fs = pphVar1;
    pphVar1 = (h264_frame_store_t **)mpp_osal_calloc("init_dpb",(ulong)p_Dpb->size << 3);
    p_Dpb->fs_ref = pphVar1;
    pphVar1 = (h264_frame_store_t **)mpp_osal_calloc("init_dpb",(ulong)p_Dpb->size << 3);
    p_Dpb->fs_ltref = pphVar1;
    pphVar1 = (h264_frame_store_t **)mpp_osal_calloc("init_dpb",8);
    p_Dpb->fs_ilref = pphVar1;
    if ((((p_Dpb->fs != (h264_frame_store_t **)0x0) && (p_Dpb->fs_ref != (h264_frame_store_t **)0x0)
         ) && (p_Dpb->fs_ltref != (h264_frame_store_t **)0x0)) &&
       (p_Dpb->fs_ilref != (h264_frame_store_t **)0x0)) {
      for (local_28 = 0; local_28 < p_Dpb->size; local_28 = local_28 + 1) {
        pHVar2 = alloc_frame_store();
        p_Dpb->fs[local_28] = pHVar2;
        if (p_Dpb->fs[local_28] == (h264_frame_store_t *)0x0) {
          if ((h264d_debug & 1) == 0) {
            return MPP_ERR_MALLOC;
          }
          _mpp_log_l(4,"h264d_dpb","malloc buffer error(%d).\n",(char *)0x0,0x7c6);
          return MPP_ERR_MALLOC;
        }
        p_Dpb->fs_ref[local_28] = (h264_frame_store_t *)0x0;
        p_Dpb->fs_ltref[local_28] = (h264_frame_store_t *)0x0;
        p_Dpb->fs[local_28]->layer_id = -1;
        p_Dpb->fs[local_28]->view_id = -1;
        p_Dpb->fs[local_28]->inter_view_flag[1] = 0;
        p_Dpb->fs[local_28]->inter_view_flag[0] = 0;
        p_Dpb->fs[local_28]->anchor_pic_flag[1] = 0;
        p_Dpb->fs[local_28]->anchor_pic_flag[0] = 0;
      }
      if (type == 2) {
        pHVar2 = alloc_frame_store();
        *p_Dpb->fs_ilref = pHVar2;
        if (*p_Dpb->fs_ilref == (h264_frame_store_t *)0x0) {
          if ((h264d_debug & 1) == 0) {
            return MPP_ERR_MALLOC;
          }
          _mpp_log_l(4,"h264d_dpb","malloc buffer error(%d).\n",(char *)0x0,2000);
          return MPP_ERR_MALLOC;
        }
        (*p_Dpb->fs_ilref)->view_id = -1;
        (*p_Dpb->fs_ilref)->inter_view_flag[1] = 0;
        (*p_Dpb->fs_ilref)->inter_view_flag[0] = 0;
        (*p_Dpb->fs_ilref)->anchor_pic_flag[1] = 0;
        (*p_Dpb->fs_ilref)->anchor_pic_flag[0] = 0;
      }
      else {
        *p_Dpb->fs_ilref = (h264_frame_store_t *)0x0;
      }
      if (p_Vid->no_ref_pic == (h264_store_pic_t *)0x0) {
        pHVar3 = alloc_storable_picture(p_Vid,3);
        p_Vid->no_ref_pic = pHVar3;
        if (p_Vid->no_ref_pic == (h264_store_pic_t *)0x0) {
          if ((h264d_debug & 1) == 0) {
            return MPP_ERR_MALLOC;
          }
          _mpp_log_l(4,"h264d_dpb","malloc buffer error(%d).\n",(char *)0x0,0x7dc);
          return MPP_ERR_MALLOC;
        }
        p_Vid->no_ref_pic->top_field = p_Vid->no_ref_pic;
        p_Vid->no_ref_pic->bottom_field = p_Vid->no_ref_pic;
        p_Vid->no_ref_pic->frame = p_Vid->no_ref_pic;
      }
      p_Dpb->last_output_poc = -0x80000000;
      p_Dpb->last_output_view_id = -1;
      p_Vid->last_has_mmco_5 = 0;
      p_Dpb->init_done = 1;
      return MPP_OK;
    }
    active_sps._4_4_ = MPP_ERR_MALLOC;
    if ((h264d_debug & 1) != 0) {
      _mpp_log_l(4,"h264d_dpb","malloc buffer error(%d).\n",(char *)0x0,0x7c3);
    }
  }
  return active_sps._4_4_;
}

Assistant:

MPP_RET init_dpb(H264dVideoCtx_t *p_Vid, H264_DpbBuf_t *p_Dpb, RK_S32 type)  // type=1 AVC type=2 MVC
{
    RK_U32 i = 0;
    MPP_RET ret = MPP_ERR_UNKNOW;
    H264_SPS_t *active_sps = p_Vid->active_sps;
    RK_U32 dpb_size;

    if (!active_sps) {
        ret = MPP_NOK;
        goto __FAILED;
    }
    p_Dpb->p_Vid = p_Vid;
    if (p_Dpb->init_done) {
        free_dpb(p_Dpb);
    }
    dpb_size = getDpbSize(p_Vid, active_sps);
    p_Dpb->size = MPP_MAX(1, dpb_size);
    p_Dpb->allocated_size = p_Dpb->size;
    p_Dpb->num_ref_frames = active_sps->max_num_ref_frames;
    if (active_sps->max_dec_frame_buffering < active_sps->max_num_ref_frames) {
        H264D_WARNNING("DPB size at specified level is smaller than reference frames");
    }
    p_Dpb->used_size = 0;
    p_Dpb->last_picture = NULL;
    p_Dpb->ref_frames_in_buffer = 0;
    p_Dpb->ltref_frames_in_buffer = 0;
    //--------
    p_Dpb->fs       = mpp_calloc(H264_FrameStore_t*, p_Dpb->size);
    p_Dpb->fs_ref   = mpp_calloc(H264_FrameStore_t*, p_Dpb->size);
    p_Dpb->fs_ltref = mpp_calloc(H264_FrameStore_t*, p_Dpb->size);
    p_Dpb->fs_ilref = mpp_calloc(H264_FrameStore_t*, 1);  //!< inter-layer reference (for multi-layered codecs)
    MEM_CHECK(ret, p_Dpb->fs && p_Dpb->fs_ref && p_Dpb->fs_ltref && p_Dpb->fs_ilref);
    for (i = 0; i < p_Dpb->size; i++) {
        p_Dpb->fs[i] = alloc_frame_store();
        MEM_CHECK(ret, p_Dpb->fs[i]);
        p_Dpb->fs_ref[i] = NULL;
        p_Dpb->fs_ltref[i] = NULL;
        p_Dpb->fs[i]->layer_id = -1;
        p_Dpb->fs[i]->view_id = -1;
        p_Dpb->fs[i]->inter_view_flag[0] = p_Dpb->fs[i]->inter_view_flag[1] = 0;
        p_Dpb->fs[i]->anchor_pic_flag[0] = p_Dpb->fs[i]->anchor_pic_flag[1] = 0;
    }
    if (type == 2) {
        p_Dpb->fs_ilref[0] = alloc_frame_store();
        MEM_CHECK(ret, p_Dpb->fs_ilref[0]);
        //!< These may need some cleanups
        p_Dpb->fs_ilref[0]->view_id = -1;
        p_Dpb->fs_ilref[0]->inter_view_flag[0] = p_Dpb->fs_ilref[0]->inter_view_flag[1] = 0;
        p_Dpb->fs_ilref[0]->anchor_pic_flag[0] = p_Dpb->fs_ilref[0]->anchor_pic_flag[1] = 0;
        //!< given that this is in a different buffer, do we even need proc_flag anymore?
    } else {
        p_Dpb->fs_ilref[0] = NULL;
    }
    //!< allocate a dummy storable picture
    if (!p_Vid->no_ref_pic) {
        p_Vid->no_ref_pic = alloc_storable_picture(p_Vid, FRAME);
        MEM_CHECK(ret, p_Vid->no_ref_pic);
        p_Vid->no_ref_pic->top_field = p_Vid->no_ref_pic;
        p_Vid->no_ref_pic->bottom_field = p_Vid->no_ref_pic;
        p_Vid->no_ref_pic->frame = p_Vid->no_ref_pic;
    }
    p_Dpb->last_output_poc = INT_MIN;
    p_Dpb->last_output_view_id = -1;
    p_Vid->last_has_mmco_5 = 0;
    p_Dpb->init_done = 1;

    return ret = MPP_OK;
__FAILED:
    return ret;
}